

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap.cpp
# Opt level: O1

Error * ot::commissioner::coap::Message::Deserialize
                  (Error *__return_storage_ptr__,OptionType *aOptionNumber,OptionValue *aOptionValue
                  ,uint16_t aLastOptionNumber,ByteArray *aBuf,size_t *aOffset)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ulong uVar2;
  byte *pbVar3;
  byte bVar4;
  pointer puVar5;
  size_t *psVar6;
  char *pcVar7;
  char *pcVar8;
  pointer puVar9;
  ulong uVar10;
  size_t __n;
  ushort uVar11;
  byte bVar12;
  ushort uVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  char *pcVar18;
  bool bVar19;
  string_view fmt;
  string_view fmt_00;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  format_args args_04;
  writer write;
  string local_d0;
  writer local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a8;
  ErrorCode local_a0 [2];
  undefined1 *local_98 [2];
  undefined1 local_88 [16];
  format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  size_t *local_40;
  OptionValue *local_38;
  
  __return_storage_ptr__->mCode = kNone;
  paVar1 = &(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p = (pointer)paVar1;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  uVar16 = *aOffset;
  puVar9 = (aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar10 = (long)(aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                 super__Vector_impl_data._M_finish - (long)puVar9;
  if (uVar16 < uVar10) {
    bVar4 = puVar9[uVar16];
    uVar13 = bVar4 & 0xf;
    lVar15 = 1;
    if (0xcf < bVar4) {
      lVar15 = 3 - (ulong)(bVar4 < 0xe0);
    }
    bVar12 = (byte)uVar13;
    lVar17 = 0;
    if (0xc < bVar12) {
      lVar17 = (ulong)(uVar13 != 0xd) + 1;
    }
    uVar2 = uVar16 + lVar17 + lVar15;
    local_a8 = paVar1;
    local_38 = aOptionValue;
    if (uVar10 < uVar2) {
      local_78._0_8_ = (ulong)(uint)local_78._4_4_ << 0x20;
      local_78.context_.super_basic_format_parse_context<char>.format_str_.data_ =
           "premature end of a CoAP option";
      local_78.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x1e;
      local_78.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
      local_78.context_.super_basic_format_parse_context<char>._20_4_ = 0;
      local_78.parse_funcs_[0] = (parse_func)0x0;
      pcVar18 = "premature end of a CoAP option";
      local_78.context_.types_ = local_78.types_;
      do {
        pcVar8 = pcVar18 + 1;
        if (*pcVar18 == '}') {
          if ((pcVar8 == "") || (*pcVar8 != '}')) {
            ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
          }
          pcVar8 = pcVar18 + 2;
        }
        else if (*pcVar18 == '{') {
          pcVar8 = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                             (pcVar18,"",&local_78);
        }
        pcVar18 = pcVar8;
      } while (pcVar8 != "");
      args.field_1.values_ =
           (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)aOffset;
      args.desc_ = (unsigned_long_long)&local_78;
      ::fmt::v10::vformat_abi_cxx11_
                (&local_d0,(v10 *)"premature end of a CoAP option",(string_view)ZEXT816(0x1e),args);
      local_a0[0] = kBadFormat;
      local_98[0] = local_88;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_98,local_d0._M_dataplus._M_p,
                 local_d0._M_dataplus._M_p + local_d0._M_string_length);
    }
    else {
      uVar11 = (ushort)(bVar4 >> 4);
      if (0xcf < bVar4) {
        if (uVar11 == 0xe) {
          uVar11 = (*(ushort *)(puVar9 + uVar16 + 1) << 8 | *(ushort *)(puVar9 + uVar16 + 1) >> 8) +
                   0x10d;
          uVar14 = uVar16 + 3;
          goto LAB_001f80f0;
        }
        if (uVar11 == 0xd) {
          uVar14 = uVar16 + 2;
          uVar11 = puVar9[uVar16 + 1] + 0xd;
          goto LAB_001f80f0;
        }
        if (bVar12 == 0xf) {
          local_78._0_8_ = (ulong)(uint)local_78._4_4_ << 0x20;
          local_78.context_.super_basic_format_parse_context<char>.format_str_.data_ =
               "cannot find more CoAP option";
          local_78.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x1c;
          local_78.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
          local_78.context_.super_basic_format_parse_context<char>._20_4_ = 0;
          local_78.parse_funcs_[0] = (parse_func)0x0;
          pcVar18 = "cannot find more CoAP option";
          local_78.context_.types_ = local_78.types_;
          do {
            pcVar8 = pcVar18 + 1;
            if (*pcVar18 == '}') {
              if ((pcVar8 == "") || (*pcVar8 != '}')) {
                ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
              }
              pcVar8 = pcVar18 + 2;
            }
            else if (*pcVar18 == '{') {
              pcVar8 = ::fmt::v10::detail::
                       parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                                 (pcVar18,"",&local_78);
            }
            pcVar18 = pcVar8;
          } while (pcVar8 != "");
          args_01.field_1.values_ =
               (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)aOffset;
          args_01.desc_ = (unsigned_long_long)&local_78;
          ::fmt::v10::vformat_abi_cxx11_
                    (&local_d0,(v10 *)"cannot find more CoAP option",(string_view)ZEXT816(0x1c),
                     args_01);
          local_a0[0] = kNotFound;
          local_98[0] = local_88;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_98,local_d0._M_dataplus._M_p,
                     local_d0._M_dataplus._M_p + local_d0._M_string_length);
          goto LAB_001f8064;
        }
        local_b0.handler_ = &local_78;
        local_78.types_[0] = uint_type;
        pcVar18 = "invalid CoAP option (firstByte={:X})";
        local_78.context_.super_basic_format_parse_context<char>.format_str_.data_ =
             "invalid CoAP option (firstByte={:X})";
        local_78.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x24;
        local_78.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
        local_78.context_.super_basic_format_parse_context<char>._20_4_ = 1;
        local_78.parse_funcs_[0] =
             ::fmt::v10::detail::
             parse_format_specs<unsigned_char,fmt::v10::detail::compile_parse_context<char>>;
        local_78.context_.types_ = (local_b0.handler_)->types_;
        do {
          if (pcVar18 == "") break;
          pcVar8 = pcVar18;
          if (*pcVar18 == '{') {
LAB_001f8535:
            ::fmt::v10::detail::
            parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_unsigned_char>_>
            ::writer::operator()(&local_b0,pcVar18,pcVar8);
            pcVar18 = ::fmt::v10::detail::
                      parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,unsigned_char>&>
                                (pcVar8,"",&local_78);
            bVar19 = true;
          }
          else {
            pcVar8 = pcVar18 + 1;
            bVar19 = pcVar8 != "";
            if (bVar19) {
              if (*pcVar8 != '{') {
                pcVar7 = pcVar18 + 2;
                do {
                  pcVar8 = pcVar7;
                  bVar19 = pcVar8 != "";
                  if (pcVar8 == "") goto LAB_001f8531;
                  pcVar7 = pcVar8 + 1;
                } while (*pcVar8 != '{');
              }
              bVar19 = true;
            }
LAB_001f8531:
            if (bVar19) goto LAB_001f8535;
            ::fmt::v10::detail::
            parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_unsigned_char>_>
            ::writer::operator()(&local_b0,pcVar18,"");
            bVar19 = false;
          }
        } while (bVar19);
        local_78._0_8_ =
             ZEXT18((aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_start[uVar16]);
        fmt_00.size_ = 2;
        fmt_00.data_ = (char *)0x24;
        args_04.field_1.values_ =
             (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)aOffset;
        args_04.desc_ = (unsigned_long_long)&local_78;
        ::fmt::v10::vformat_abi_cxx11_
                  (&local_d0,(v10 *)"invalid CoAP option (firstByte={:X})",fmt_00,args_04);
        local_a0[0] = kBadFormat;
        local_98[0] = local_88;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_98,local_d0._M_dataplus._M_p,
                   local_d0._M_dataplus._M_p + local_d0._M_string_length);
LAB_001f85cb:
        __return_storage_ptr__->mCode = local_a0[0];
        goto LAB_001f806f;
      }
      uVar14 = uVar16 + 1;
LAB_001f80f0:
      if (0xc < bVar12) {
        if (bVar12 == 0xe) {
          uVar13 = (*(ushort *)(puVar9 + uVar14) << 8 | *(ushort *)(puVar9 + uVar14) >> 8) + 0x10d;
          uVar14 = uVar14 + 2;
        }
        else {
          if (uVar13 != 0xd) {
            local_b0.handler_ = &local_78;
            local_78.types_[0] = uint_type;
            pcVar18 = "invalid CoAP option (firstByte={:X})";
            local_78.context_.super_basic_format_parse_context<char>.format_str_.data_ =
                 "invalid CoAP option (firstByte={:X})";
            local_78.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x24;
            local_78.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
            local_78.context_.super_basic_format_parse_context<char>._20_4_ = 1;
            local_78.parse_funcs_[0] =
                 ::fmt::v10::detail::
                 parse_format_specs<unsigned_char,fmt::v10::detail::compile_parse_context<char>>;
            local_78.context_.types_ = (local_b0.handler_)->types_;
            do {
              if (pcVar18 == "") break;
              pcVar8 = pcVar18;
              if (*pcVar18 == '{') {
LAB_001f83ad:
                ::fmt::v10::detail::
                parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_unsigned_char>_>
                ::writer::operator()(&local_b0,pcVar18,pcVar8);
                pcVar18 = ::fmt::v10::detail::
                          parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,unsigned_char>&>
                                    (pcVar8,"",&local_78);
                bVar19 = true;
              }
              else {
                pcVar8 = pcVar18 + 1;
                bVar19 = pcVar8 != "";
                if (bVar19) {
                  if (*pcVar8 != '{') {
                    pcVar7 = pcVar18 + 2;
                    do {
                      pcVar8 = pcVar7;
                      bVar19 = pcVar8 != "";
                      if (pcVar8 == "") goto LAB_001f83a9;
                      pcVar7 = pcVar8 + 1;
                    } while (*pcVar8 != '{');
                  }
                  bVar19 = true;
                }
LAB_001f83a9:
                if (bVar19) goto LAB_001f83ad;
                ::fmt::v10::detail::
                parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_unsigned_char>_>
                ::writer::operator()(&local_b0,pcVar18,"");
                bVar19 = false;
              }
            } while (bVar19);
            local_78._0_8_ =
                 ZEXT18((aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                        _M_impl.super__Vector_impl_data._M_start[uVar16]);
            fmt.size_ = 2;
            fmt.data_ = (char *)0x24;
            args_03.field_1.values_ =
                 (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)aOffset;
            args_03.desc_ = (unsigned_long_long)&local_78;
            ::fmt::v10::vformat_abi_cxx11_
                      (&local_d0,(v10 *)"invalid CoAP option (firstByte={:X})",fmt,args_03);
            local_a0[0] = kBadFormat;
            local_98[0] = local_88;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_98,local_d0._M_dataplus._M_p,
                       local_d0._M_dataplus._M_p + local_d0._M_string_length);
            goto LAB_001f85cb;
          }
          pbVar3 = puVar9 + uVar14;
          uVar14 = uVar14 + 1;
          uVar13 = *pbVar3 + 0xd;
        }
      }
      if (uVar2 != uVar14) {
        abort();
      }
      uVar16 = (ulong)uVar13;
      if (uVar14 + uVar16 <= uVar10) {
        *aOptionNumber = uVar11 + aLastOptionNumber;
        local_40 = aOffset;
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        vector<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_78,
                   (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )(puVar9 + uVar14),
                   (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )(puVar9 + uVar14 + uVar16),(allocator_type *)local_a0);
        uVar10 = (long)local_78.context_.super_basic_format_parse_context<char>.format_str_.data_ -
                 local_78._0_8_;
        if (uVar10 == 0) {
          puVar9 = (pointer)0x0;
        }
        else {
          if ((long)uVar10 < 0) {
            std::__throw_bad_alloc();
          }
          puVar9 = (pointer)operator_new(uVar10);
        }
        __n = (long)local_78.context_.super_basic_format_parse_context<char>.format_str_.data_ -
              local_78._0_8_;
        if (__n != 0) {
          memmove(puVar9,(void *)local_78._0_8_,__n);
        }
        puVar5 = (local_38->mValue).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        (local_38->mValue).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
        .super__Vector_impl_data._M_start = puVar9;
        (local_38->mValue).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
        .super__Vector_impl_data._M_finish = puVar9 + __n;
        (local_38->mValue).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage = puVar9 + uVar10;
        if (puVar5 != (pointer)0x0) {
          operator_delete(puVar5);
        }
        psVar6 = local_40;
        if ((void *)local_78._0_8_ != (void *)0x0) {
          operator_delete((void *)local_78._0_8_);
        }
        *psVar6 = *psVar6 + uVar16 + lVar17 + lVar15;
        return __return_storage_ptr__;
      }
      local_78._0_8_ = (ulong)(uint)local_78._4_4_ << 0x20;
      local_78.context_.super_basic_format_parse_context<char>.format_str_.data_ =
           "premature end of a CoAP option";
      local_78.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x1e;
      local_78.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
      local_78.context_.super_basic_format_parse_context<char>._20_4_ = 0;
      local_78.parse_funcs_[0] = (parse_func)0x0;
      pcVar18 = "premature end of a CoAP option";
      local_78.context_.types_ = local_78.types_;
      do {
        pcVar8 = pcVar18 + 1;
        if (*pcVar18 == '}') {
          if ((pcVar8 == "") || (*pcVar8 != '}')) {
            ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
          }
          pcVar8 = pcVar18 + 2;
        }
        else if (*pcVar18 == '{') {
          pcVar8 = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                             (pcVar18,"",&local_78);
        }
        pcVar18 = pcVar8;
      } while (pcVar8 != "");
      args_02.field_1.values_ =
           (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)aOffset;
      args_02.desc_ = (unsigned_long_long)&local_78;
      ::fmt::v10::vformat_abi_cxx11_
                (&local_d0,(v10 *)"premature end of a CoAP option",(string_view)ZEXT816(0x1e),
                 args_02);
      local_a0[0] = kBadFormat;
      local_98[0] = local_88;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_98,local_d0._M_dataplus._M_p,
                 local_d0._M_dataplus._M_p + local_d0._M_string_length);
    }
  }
  else {
    local_78._0_8_ = (ulong)(uint)local_78._4_4_ << 0x20;
    local_78.context_.super_basic_format_parse_context<char>.format_str_.data_ =
         "premature end of a CoAP option";
    local_78.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x1e;
    local_78.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
    local_78.context_.super_basic_format_parse_context<char>._20_4_ = 0;
    local_78.parse_funcs_[0] = (parse_func)0x0;
    pcVar18 = "premature end of a CoAP option";
    local_78.context_.types_ = local_78.types_;
    do {
      pcVar8 = pcVar18 + 1;
      if (*pcVar18 == '}') {
        if ((pcVar8 == "") || (*pcVar8 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar8 = pcVar18 + 2;
      }
      else if (*pcVar18 == '{') {
        pcVar8 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar18,"",&local_78);
      }
      pcVar18 = pcVar8;
    } while (pcVar8 != "");
    args_00.field_1.values_ =
         (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)aOffset;
    args_00.desc_ = (unsigned_long_long)&local_78;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_d0,(v10 *)"premature end of a CoAP option",(string_view)ZEXT816(0x1e),args_00)
    ;
    local_a0[0] = kBadFormat;
    local_98[0] = local_88;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_98,local_d0._M_dataplus._M_p,
               local_d0._M_dataplus._M_p + local_d0._M_string_length);
  }
LAB_001f8064:
  __return_storage_ptr__->mCode = local_a0[0];
LAB_001f806f:
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->mMessage,(string *)local_98);
  if (local_98[0] != local_88) {
    operator_delete(local_98[0]);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

Error Message::Deserialize(OptionType      &aOptionNumber,
                           OptionValue     &aOptionValue,
                           uint16_t         aLastOptionNumber,
                           const ByteArray &aBuf,
                           size_t          &aOffset)
{
    Error    error;
    uint16_t delta;
    uint16_t length;
    uint16_t valueLength;
    size_t   firstByte = aOffset;
    size_t   extend    = aOffset + 1;

    VerifyOrExit(firstByte < aBuf.size(), error = ERROR_BAD_FORMAT("premature end of a CoAP option"));

    delta       = aBuf[firstByte] >> 4;
    valueLength = aBuf[firstByte] & 0x0f;

    length = 1;
    length += delta < kOption1ByteExtension ? 0 : (delta < kOption2ByteExtension ? 1 : 2);
    length += valueLength < kOption1ByteExtension ? 0 : (valueLength < kOption2ByteExtension ? 1 : 2);

    VerifyOrExit(firstByte + length <= aBuf.size(), error = ERROR_BAD_FORMAT("premature end of a CoAP option"));

    if (delta < kOption1ByteExtension)
    {
        // do nothing
    }
    else if (delta == kOption1ByteExtension)
    {
        delta = kOption1ByteExtensionOffset + aBuf[extend++];
    }
    else if (delta == kOption2ByteExtension)
    {
        delta = kOption2ByteExtensionOffset + ((static_cast<uint16_t>(aBuf[extend]) << 8) | aBuf[extend + 1]);
        extend += 2;
    }
    else
    {
        // we have delta == 0x0f

        VerifyOrExit(valueLength == 0x0f,
                     error = ERROR_BAD_FORMAT("invalid CoAP option (firstByte={:X})", aBuf[firstByte]));
        ExitNow(error = ERROR_NOT_FOUND("cannot find more CoAP option"));
    }

    if (valueLength < kOption1ByteExtension)
    {
        // do nothing
    }
    else if (valueLength == kOption1ByteExtension)
    {
        valueLength = kOption1ByteExtensionOffset + aBuf[extend++];
    }
    else if (valueLength == kOption2ByteExtension)
    {
        valueLength = kOption2ByteExtensionOffset + ((static_cast<uint16_t>(aBuf[extend]) << 8) | aBuf[extend + 1]);
        extend += 2;
    }
    else
    {
        ExitNow(error = ERROR_BAD_FORMAT("invalid CoAP option (firstByte={:X})", aBuf[firstByte]));
    }

    VerifyOrDie(firstByte + length == extend);

    VerifyOrExit(valueLength + extend <= aBuf.size(), error = ERROR_BAD_FORMAT("premature end of a CoAP option"));

    aOptionNumber = utils::from_underlying<OptionType>(aLastOptionNumber + delta);
    aOptionValue  = OptionValue{ByteArray{aBuf.begin() + extend, aBuf.begin() + extend + valueLength}};

    aOffset += length + valueLength;

exit:
    return error;
}